

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O3

void soul::SanityCheckPass::checkOverallStructureOfProcessor(ProcessorBase *processorOrGraph)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  pool_ref<soul::AST::EndpointDeclaration> *e;
  undefined4 extraout_var;
  long *plVar4;
  long *plVar5;
  undefined4 extraout_var_01;
  long lVar6;
  long *extraout_RDX;
  long *extraout_RDX_00;
  long *extraout_RDX_01;
  Identifier *in_R9;
  undefined1 auVar7 [16];
  string_view other;
  string_view other_00;
  string_view other_01;
  undefined1 local_160 [4];
  int local_15c;
  Structure *local_150;
  CompileMessage local_148;
  CompileMessage local_110;
  CompileMessage local_d8;
  CompileMessage local_a0;
  CompileMessage local_68;
  undefined4 extraout_var_00;
  
  iVar3 = (*(processorOrGraph->super_ModuleBase).super_ASTObject._vptr_ASTObject[8])();
  plVar4 = (long *)CONCAT44(extraout_var,iVar3);
  if (plVar4 == extraout_RDX) {
LAB_00205515:
    CompileMessageHelpers::createMessage<>
              (&local_68,syntax,error,"A processor must declare at least one output");
    AST::Context::throwError
              (&(processorOrGraph->super_ModuleBase).super_ASTObject.context,&local_68,false);
  }
  lVar6 = 0;
  do {
    lVar6 = lVar6 + ((ulong)*(byte *)(*plVar4 + 0x28) ^ 1);
    plVar4 = plVar4 + 1;
  } while (plVar4 != extraout_RDX);
  if (lVar6 == 0) goto LAB_00205515;
  plVar4 = (long *)__dynamic_cast(processorOrGraph,&AST::ProcessorBase::typeinfo,
                                  &AST::Processor::typeinfo,0);
  if (plVar4 == (long *)0x0) {
    return;
  }
  auVar7 = (**(code **)(*plVar4 + 0xb0))(plVar4);
  plVar5 = auVar7._0_8_;
  if (plVar5 != auVar7._8_8_) {
    iVar3 = 0;
    do {
      other._M_str = "run";
      other._M_len = 3;
      bVar2 = Identifier::operator==((Identifier *)(*plVar5 + 0x38),other);
      if ((bVar2) ||
         (other_00._M_str = "init", other_00._M_len = 4,
         bVar2 = Identifier::operator==((Identifier *)(*plVar5 + 0x38),other_00), bVar2)) {
        if (*(long **)(*plVar5 + 0x30) == (long *)0x0) {
          throwInternalCompilerError("object != nullptr","operator->",0x3c);
        }
        (**(code **)(**(long **)(*plVar5 + 0x30) + 0x28))(local_160);
        iVar1 = local_15c;
        RefCountedPtr<soul::Structure>::decIfNotNull(local_150);
        lVar6 = *plVar5;
        if (iVar1 != 1) {
          CompileMessageHelpers::createMessage<soul::Identifier&>
                    (&local_a0,(CompileMessageHelpers *)0x1,none,0x2a062a,(char *)(lVar6 + 0x38),
                     in_R9);
          AST::Context::throwError((Context *)(lVar6 + 0x10),&local_a0,false);
        }
        if (*(long *)(lVar6 + 0x58) != *(long *)(lVar6 + 0x60)) {
          CompileMessageHelpers::createMessage<soul::Identifier&>
                    (&local_d8,(CompileMessageHelpers *)0x1,none,0x2a0650,(char *)(lVar6 + 0x38),
                     in_R9);
          AST::Context::throwError((Context *)(lVar6 + 0x10),&local_d8,false);
        }
        other_01._M_str = "run";
        other_01._M_len = 3;
        bVar2 = Identifier::operator==((Identifier *)(lVar6 + 0x38),other_01);
        iVar3 = iVar3 + (uint)bVar2;
      }
      plVar5 = plVar5 + 1;
    } while (plVar5 != auVar7._8_8_);
    if (iVar3 != 0) goto LAB_0020543c;
  }
  iVar3 = (*(processorOrGraph->super_ModuleBase).super_ASTObject._vptr_ASTObject[8])();
  plVar5 = (long *)CONCAT44(extraout_var_00,iVar3);
  if (plVar5 != extraout_RDX_00) {
    iVar3 = 0;
    do {
      if ((*(EndpointDetails **)(*plVar5 + 0x38) == (EndpointDetails *)0x0) ||
         (bVar2 = AST::EndpointDetails::isResolved(*(EndpointDetails **)(*plVar5 + 0x38)), !bVar2))
      goto LAB_0020543c;
      plVar5 = plVar5 + 1;
    } while (plVar5 != extraout_RDX_00);
  }
  iVar3 = (*(processorOrGraph->super_ModuleBase).super_ASTObject._vptr_ASTObject[8])();
  plVar5 = (long *)CONCAT44(extraout_var_01,iVar3);
  while( true ) {
    if (plVar5 == extraout_RDX_01) {
      CompileMessageHelpers::createMessage<>
                (&local_110,syntax,error,"A processor must contain a run() function");
      AST::Context::throwError((Context *)(plVar4 + 2),&local_110,false);
    }
    if (*(int **)(*plVar5 + 0x38) == (int *)0x0) {
      throwInternalCompilerError("object != nullptr","operator*",0x3b);
    }
    if (**(int **)(*plVar5 + 0x38) == 3) break;
    plVar5 = plVar5 + 1;
  }
  iVar3 = 0;
LAB_0020543c:
  if (iVar3 < 2) {
    return;
  }
  CompileMessageHelpers::createMessage<>
            (&local_148,syntax,error,"A processor cannot contain more than one run() function");
  AST::Context::throwError((Context *)(plVar4 + 2),&local_148,false);
}

Assistant:

static void checkOverallStructureOfProcessor (AST::ProcessorBase& processorOrGraph)
    {
        if (processorOrGraph.getNumOutputs() == 0)
            processorOrGraph.context.throwError (Errors::processorNeedsAnOutput());

        if (auto processor = cast<AST::Processor> (processorOrGraph))
        {
            int numRunFunctions = 0;

            for (auto& f : processor->getFunctions())
            {
                if (f->isRunFunction() || f->isUserInitFunction())
                {
                    if (! f->returnType->resolveAsType().isVoid())
                        f->context.throwError (Errors::functionMustBeVoid (f->name));

                    if (! f->parameters.empty())
                        f->context.throwError (Errors::functionHasParams (f->name));

                    if (f->isRunFunction())
                        ++numRunFunctions;
                }
            }

            // If the processor has non-event I/O then we need a run processor
            if (numRunFunctions == 0)
            {
                auto areAllEndpointsResolved = [&]
                {
                    for (auto e : processorOrGraph.getEndpoints())
                        if (! e->isResolved())
                            return false;

                    return true;
                };

                auto hasAnEventEndpoint = [&]
                {
                    for (auto e : processorOrGraph.getEndpoints())
                        if (isEvent (e->getDetails()))
                            return true;

                    return false;
                };

                if (areAllEndpointsResolved() && ! hasAnEventEndpoint())
                    processor->context.throwError (Errors::processorNeedsRunFunction());
            }

            if (numRunFunctions > 1)
                processor->context.throwError (Errors::multipleRunFunctions());
        }
    }